

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O2

void pzshape::TPZShapeDisc::Shape2D
               (REAL C,TPZVec<double> *X0,TPZVec<double> *X,int degree,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi,MShapeType type)

{
  long lVar1;
  long row;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  long lVar9;
  long row_00;
  long lVar10;
  long lVar11;
  TPZFNMatrix<660,_double> phix;
  TPZFNMatrix<660,_double> phiy;
  TPZFNMatrix<660,_double> dphiy;
  TPZFNMatrix<660,_double> dphix;
  
  if (degree == 0) {
    pdVar8 = TPZFMatrix<double>::operator()(phi,0,0);
    *pdVar8 = 1.0;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,0,0);
    *pdVar8 = 0.0;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,1,0);
    *pdVar8 = 0.0;
  }
  else {
    dVar2 = *X0->fStore;
    dVar3 = X0->fStore[1];
    dVar4 = *X->fStore;
    dVar5 = X->fStore[1];
    TPZFNMatrix<660,_double>::TPZFNMatrix(&phix);
    TPZFNMatrix<660,_double>::TPZFNMatrix(&phiy);
    TPZFNMatrix<660,_double>::TPZFNMatrix(&dphix);
    TPZFNMatrix<660,_double>::TPZFNMatrix(&dphiy);
    (*(code *)fOrthogonal)(C,dVar2,dVar4,degree,&phix,&dphix,1);
    (*(code *)fOrthogonal)(C,dVar3,dVar5,degree,&phiy,&dphiy,1);
    iVar6 = NShapeF(degree,2,type);
    (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
              (phi,(long)iVar6,1);
    (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
              (dphi,2,(long)iVar6);
    (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (phi);
    (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (dphi);
    if (type == EOrdemTotal) {
      iVar7 = 0;
      for (lVar11 = 0; lVar11 <= degree; lVar11 = lVar11 + 1) {
        lVar9 = 0;
        for (lVar10 = lVar11; lVar10 != -1; lVar10 = lVar10 + -1) {
          pdVar8 = TPZFMatrix<double>::operator()(&phix.super_TPZFMatrix<double>,lVar9,0);
          dVar2 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(&phiy.super_TPZFMatrix<double>,lVar10,0);
          lVar1 = iVar7 + lVar9;
          dVar3 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(phi,lVar1,0);
          *pdVar8 = dVar2 * dVar3;
          pdVar8 = TPZFMatrix<double>::operator()(&dphix.super_TPZFMatrix<double>,0,lVar9);
          dVar2 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(&phiy.super_TPZFMatrix<double>,lVar10,0);
          dVar3 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(dphi,0,lVar1);
          *pdVar8 = dVar2 * dVar3;
          pdVar8 = TPZFMatrix<double>::operator()(&phix.super_TPZFMatrix<double>,lVar9,0);
          dVar2 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(&dphiy.super_TPZFMatrix<double>,0,lVar10);
          dVar3 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(dphi,1,lVar1);
          *pdVar8 = dVar2 * dVar3;
          lVar9 = lVar9 + 1;
        }
        iVar7 = iVar7 + (int)lVar9;
      }
    }
    else {
      iVar7 = 0;
      for (lVar11 = 0; lVar11 <= degree; lVar11 = lVar11 + 1) {
        lVar9 = (long)iVar7 << 0x20;
        for (lVar10 = 0; lVar1 = iVar7 + lVar10, lVar11 != lVar10; lVar10 = lVar10 + 1) {
          pdVar8 = TPZFMatrix<double>::operator()(&phix.super_TPZFMatrix<double>,lVar10,0);
          dVar2 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(&phiy.super_TPZFMatrix<double>,lVar11,0);
          dVar3 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(phi,lVar1,0);
          *pdVar8 = dVar2 * dVar3;
          pdVar8 = TPZFMatrix<double>::operator()(&dphix.super_TPZFMatrix<double>,0,lVar10);
          dVar2 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(&phiy.super_TPZFMatrix<double>,lVar11,0);
          dVar3 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(dphi,0,lVar1);
          *pdVar8 = dVar2 * dVar3;
          pdVar8 = TPZFMatrix<double>::operator()(&phix.super_TPZFMatrix<double>,lVar10,0);
          dVar2 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(&dphiy.super_TPZFMatrix<double>,0,lVar11);
          dVar3 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(dphi,1,lVar1);
          *pdVar8 = dVar2 * dVar3;
          lVar9 = lVar9 + 0x100000000;
        }
        for (row_00 = 0; lVar11 != row_00; row_00 = row_00 + 1) {
          pdVar8 = TPZFMatrix<double>::operator()(&phix.super_TPZFMatrix<double>,lVar11,0);
          dVar2 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(&phiy.super_TPZFMatrix<double>,row_00,0);
          row = row_00 + lVar1;
          dVar3 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(phi,row,0);
          *pdVar8 = dVar2 * dVar3;
          pdVar8 = TPZFMatrix<double>::operator()(&dphix.super_TPZFMatrix<double>,0,lVar11);
          dVar2 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(&phiy.super_TPZFMatrix<double>,row_00,0);
          dVar3 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(dphi,0,row);
          *pdVar8 = dVar2 * dVar3;
          pdVar8 = TPZFMatrix<double>::operator()(&phix.super_TPZFMatrix<double>,lVar11,0);
          dVar2 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(&dphiy.super_TPZFMatrix<double>,0,row_00);
          dVar3 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()(dphi,1,row);
          *pdVar8 = dVar2 * dVar3;
          lVar9 = lVar9 + 0x100000000;
        }
        pdVar8 = TPZFMatrix<double>::operator()(&phix.super_TPZFMatrix<double>,lVar11,0);
        dVar2 = *pdVar8;
        pdVar8 = TPZFMatrix<double>::operator()(&phiy.super_TPZFMatrix<double>,lVar11,0);
        dVar3 = *pdVar8;
        lVar9 = lVar9 >> 0x20;
        pdVar8 = TPZFMatrix<double>::operator()(phi,lVar9,0);
        *pdVar8 = dVar2 * dVar3;
        pdVar8 = TPZFMatrix<double>::operator()(&dphix.super_TPZFMatrix<double>,0,lVar11);
        dVar2 = *pdVar8;
        pdVar8 = TPZFMatrix<double>::operator()(&phiy.super_TPZFMatrix<double>,lVar11,0);
        dVar3 = *pdVar8;
        pdVar8 = TPZFMatrix<double>::operator()(dphi,0,lVar9);
        *pdVar8 = dVar2 * dVar3;
        pdVar8 = TPZFMatrix<double>::operator()(&phix.super_TPZFMatrix<double>,lVar11,0);
        dVar2 = *pdVar8;
        pdVar8 = TPZFMatrix<double>::operator()(&dphiy.super_TPZFMatrix<double>,0,lVar11);
        dVar3 = *pdVar8;
        pdVar8 = TPZFMatrix<double>::operator()(dphi,1,lVar9);
        *pdVar8 = dVar2 * dVar3;
        iVar7 = iVar7 + (int)lVar10 + (int)row_00 + 1;
      }
    }
    if (iVar7 != iVar6) {
      std::operator<<((ostream *)&std::cerr,"TPZShapeDisc::Shape2D wrong shape count\n");
    }
    pdVar8 = TPZFMatrix<double>::operator()(phi,0,0);
    dVar2 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,0,0);
    dVar3 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,1,0);
    dVar4 = *pdVar8;
    lVar11 = (long)(iVar6 + -1);
    pdVar8 = TPZFMatrix<double>::operator()(phi,lVar11,0);
    dVar5 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(phi,0,0);
    *pdVar8 = dVar5;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,0,lVar11);
    dVar5 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,0,0);
    *pdVar8 = dVar5;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,1,lVar11);
    dVar5 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,1,0);
    *pdVar8 = dVar5;
    pdVar8 = TPZFMatrix<double>::operator()(phi,lVar11,0);
    *pdVar8 = dVar2;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,0,lVar11);
    *pdVar8 = dVar3;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,1,lVar11);
    *pdVar8 = dVar4;
    TPZFNMatrix<660,_double>::~TPZFNMatrix(&dphiy);
    TPZFNMatrix<660,_double>::~TPZFNMatrix(&dphix);
    TPZFNMatrix<660,_double>::~TPZFNMatrix(&phiy);
    TPZFNMatrix<660,_double>::~TPZFNMatrix(&phix);
  }
  return;
}

Assistant:

void TPZShapeDisc::Shape2D(REAL C,TPZVec<REAL> &X0,TPZVec<REAL> &X,int degree,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi, MShapeType type){

  if(degree == 0) {
    phi(0,0) = 1.;
    dphi(0,0) = 0.;
    dphi(1,0) = 0.;
    return;
  }
  REAL x0 = X0[0];
  REAL y0 = X0[1];
  REAL x = X[0];
  REAL y = X[1];

  TPZFNMatrix<660> phix,phiy,dphix,dphiy;

  fOrthogonal(C,x0,x,degree,phix,dphix,1);
  fOrthogonal(C,y0,y,degree,phiy,dphiy,1);

  int i, j, ix, iy, counter=0, num = degree+1;

  int nshape = NShapeF(degree,2,type);
//  int count=num,ind=0;
  phi.Redim(nshape,1);
  dphi.Redim(2,nshape);
  phi.Zero();
  dphi.Zero();

  if(type==EOrdemTotal)
  {
  //mounts the shape function according to the max order:
  //  ____
  // |///
  // |//
  // |/

    for(i = 0; i <= degree; i++)
    {
       for(j = 0; j <= i; j++)
       {
          // notice that ix+iy is always constant for given i
          ix = j;
	  iy = i - j;
          phi(counter,0) = phix(ix,0)*phiy(iy,0);
          dphi(0,counter) = dphix(0,ix)*phiy(iy,0);
          dphi(1,counter) = phix(ix,0)*dphiy(0,iy);
          counter++;
       }
    }
  }else{
  // mounts the shape functions according to each
  // direction order
  // The functions are assembled in this sequence:
  // x functions, y functions, max xy
  // (horizontal, vertical lines and the 0 in the graph)
  // _____
  // |0|||
  // |-0||
  // |--0|
  // |---0
    // type == ETensorial
    for(i=0;i<num;i++)
    {
      for(j=0;j<i;j++)
      {
         ix = j;
	 iy = i;
         phi(counter,0) = phix(ix,0)*phiy(iy,0);
         dphi(0,counter) = dphix(0,ix)*phiy(iy,0);
         dphi(1,counter) = phix(ix,0)*dphiy(0,iy);
	 counter++;
      }
      for(j=0;j<i;j++)
      {
         ix = i;
	 iy = j;
         phi(counter,0) = phix(ix,0)*phiy(iy,0);
         dphi(0,counter) = dphix(0,ix)*phiy(iy,0);
         dphi(1,counter) = phix(ix,0)*dphiy(0,iy);
	 counter++;
      }

      ix = i;
      iy = i;
      phi(counter,0) = phix(ix,0)*phiy(iy,0);
      dphi(0,counter) = dphix(0,ix)*phiy(iy,0);
      dphi(1,counter) = phix(ix,0)*dphiy(0,iy);
      counter++;
    }
  }

  if(counter != nshape) {
    PZError << "TPZShapeDisc::Shape2D wrong shape count\n";
  }
  REAL phi0,dphi0[2];
  phi0 = phi(0,0);//here
  dphi0[0] = dphi(0,0);
  dphi0[1] = dphi(1,0);
  phi(0,0) = phi(nshape-1,0);//here
  dphi(0,0) = dphi(0,nshape-1);
  dphi(1,0) = dphi(1,nshape-1);

  phi(nshape-1,0) = phi0;//here
  dphi(0,nshape-1) = dphi0[0];
  dphi(1,nshape-1) = dphi0[1];
}